

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O1

long __thiscall
glcts::anon_unknown_0::
CBufferIndirectDrawElementsNoFirstIndex<glcts::(anonymous_namespace)::test_api::GL>::Run
          (CBufferIndirectDrawElementsNoFirstIndex<glcts::(anonymous_namespace)::test_api::GL> *this
          )

{
  CallLogWrapper *this_00;
  GLsizei GVar1;
  uint uVar2;
  uint uVar3;
  GLuint GVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  long lVar7;
  long lVar8;
  size_type __n;
  CColorArray coords;
  CElementArray elements;
  CColorArray bufferTest;
  DrawElementsIndirectCommand indirectElements;
  CColorArray bufferRef2;
  CColorArray bufferRef1;
  DIResult result;
  allocator_type local_569;
  string local_568;
  string local_540;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_520;
  uint local_508;
  undefined4 uStack_504;
  ulong uStack_500;
  undefined4 local_4f8;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_4e8;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_4d0;
  undefined1 local_4b8 [8];
  _func_int **pp_Stack_4b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a8 [23];
  long local_338;
  DILogger local_328;
  DILogger local_1a8;
  
  anon_unknown_0::shaders::vshSimple<glcts::(anonymous_namespace)::test_api::GL>();
  local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_568,0x1b3c1e9);
  anon_unknown_0::shaders::fshSimple<glcts::(anonymous_namespace)::test_api::GL>();
  GVar4 = DrawIndirectBase::CreateProgram
                    (&this->super_DrawIndirectBase,(string *)local_4b8,&local_568,&local_540,true);
  this->_program = GVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_540._M_dataplus._M_p != &local_540.field_2) {
    operator_delete(local_540._M_dataplus._M_p,local_540.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_568._M_dataplus._M_p != &local_568.field_2) {
    operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
  }
  if (local_4b8 != (undefined1  [8])local_4a8) {
    operator_delete((void *)local_4b8,local_4a8[0]._M_allocated_capacity + 1);
  }
  if (this->_program == 0) {
    lVar7 = -1;
  }
  else {
    this_00 = &(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
    ;
    glu::CallLogWrapper::glUseProgram(this_00,this->_program);
    local_568._M_dataplus._M_p = (pointer)0x0;
    local_568._M_string_length = 0;
    local_568.field_2._M_allocated_capacity = 0;
    DrawIndirectBase::PrimitiveGen(&this->super_DrawIndirectBase,4,8,8,(CColorArray *)&local_568);
    glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->_vao);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->_vao);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_buffer);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->_buffer);
    glu::CallLogWrapper::glBufferData
              (this_00,0x8892,local_568._M_string_length - (long)local_568._M_dataplus._M_p,
               local_568._M_dataplus._M_p,0x88e0);
    glu::CallLogWrapper::glVertexAttribPointer(this_00,0,4,0x1406,'\0',0x10,(void *)0x0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
    local_4f8 = 0;
    __n = (long)(local_568._M_string_length - (long)local_568._M_dataplus._M_p) >> 4;
    uStack_500 = __n >> 1;
    _local_508 = CONCAT44(1,(uint)uStack_500 & 0x7fffffff);
    uStack_500 = uStack_500 & 0x7fffffff;
    local_4b8 = (undefined1  [8])((ulong)(uint)local_4b8._4_4_ << 0x20);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_540,__n,
               (value_type_conflict4 *)local_4b8,(allocator_type *)&local_4d0);
    if (local_540._M_string_length - (long)local_540._M_dataplus._M_p != 0) {
      lVar7 = (long)(local_540._M_string_length - (long)local_540._M_dataplus._M_p) >> 2;
      lVar8 = 0;
      do {
        *(int *)(local_540._M_dataplus._M_p + lVar8 * 4) = (int)lVar8;
        lVar8 = lVar8 + 1;
      } while (lVar7 + (ulong)(lVar7 == 0) != lVar8);
    }
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_bufferIndirect);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,this->_bufferIndirect);
    glu::CallLogWrapper::glBufferData(this_00,0x8f3f,0x14,&local_508,0x88e4);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_ebo);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8893,this->_ebo);
    glu::CallLogWrapper::glBufferData
              (this_00,0x8893,local_540._M_string_length - (long)local_540._M_dataplus._M_p,
               local_540._M_dataplus._M_p,0x88e4);
    glu::CallLogWrapper::glDrawElementsIndirect(this_00,4,0x1405,(void *)0x0);
    iVar5 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar5 = *(int *)CONCAT44(extraout_var,iVar5);
    iVar6 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    local_4b8 = (undefined1  [8])0x0;
    pp_Stack_4b0 = (_func_int **)0x0;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&local_4d0,(long)((iVar5 * *(int *)(CONCAT44(extraout_var_00,iVar6) + 4)) / 2),
               (value_type *)local_4b8,(allocator_type *)&local_4e8);
    iVar5 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar5 = *(int *)CONCAT44(extraout_var_01,iVar5);
    iVar6 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    local_4b8 = (undefined1  [8])0x3e4ccccd3dcccccd;
    pp_Stack_4b0 = (_func_int **)0x3f8000003e99999a;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&local_4e8,(long)((iVar5 * *(int *)(CONCAT44(extraout_var_02,iVar6) + 4)) / 2),
               (value_type *)local_4b8,(allocator_type *)&local_520);
    iVar5 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar5 = *(int *)CONCAT44(extraout_var_03,iVar5);
    iVar6 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    local_4b8 = (undefined1  [8])0x0;
    pp_Stack_4b0 = (_func_int **)0x0;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&local_520,(long)(iVar5 * *(int *)(CONCAT44(extraout_var_04,iVar6) + 4)),
               (value_type *)local_4b8,&local_569);
    local_4b8 = (undefined1  [8])((ulong)local_4b8 & 0xffffffffffffff00);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_4b0);
    local_338 = 0;
    iVar5 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    GVar1 = *(GLsizei *)CONCAT44(extraout_var_05,iVar5);
    iVar5 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    glu::CallLogWrapper::glReadPixels
              (this_00,0,0,GVar1,*(int *)(CONCAT44(extraout_var_06,iVar5) + 4) / 2,0x1908,0x1406,
               local_520.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    iVar5 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    uVar2 = *(uint *)CONCAT44(extraout_var_07,iVar5);
    iVar5 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar5 = *(int *)(CONCAT44(extraout_var_08,iVar5) + 4);
    iVar6 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    uVar3 = *(uint *)CONCAT44(extraout_var_09,iVar6);
    iVar6 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    lVar7 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                      ((DrawIndirectBase *)this,&local_520,uVar2,iVar5 / 2,&local_4d0,uVar3,
                       *(int *)(CONCAT44(extraout_var_10,iVar6) + 4) / 2);
    DIResult::sub_result(&local_1a8,(DIResult *)local_4b8,lVar7);
    DILogger::~DILogger(&local_1a8);
    iVar5 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar5 = *(int *)(CONCAT44(extraout_var_11,iVar5) + 4);
    iVar6 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    GVar1 = *(GLsizei *)CONCAT44(extraout_var_12,iVar6);
    iVar6 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    glu::CallLogWrapper::glReadPixels
              (this_00,0,(iVar5 - (iVar5 + 1 >> 0x1f)) + 1 >> 1,GVar1,
               *(int *)(CONCAT44(extraout_var_13,iVar6) + 4) / 2,0x1908,0x1406,
               local_520.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    iVar5 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    uVar2 = *(uint *)CONCAT44(extraout_var_14,iVar5);
    iVar5 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar5 = *(int *)(CONCAT44(extraout_var_15,iVar5) + 4);
    iVar6 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    uVar3 = *(uint *)CONCAT44(extraout_var_16,iVar6);
    iVar6 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    lVar7 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                      ((DrawIndirectBase *)this,&local_520,uVar2,iVar5 / 2,&local_4e8,uVar3,
                       *(int *)(CONCAT44(extraout_var_17,iVar6) + 4) / 2);
    DIResult::sub_result(&local_328,(DIResult *)local_4b8,lVar7);
    DILogger::~DILogger(&local_328);
    lVar7 = local_338;
    DILogger::~DILogger((DILogger *)local_4b8);
    if (local_520.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_520.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_520.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_520.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_4e8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4e8.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_4e8.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_4e8.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_4d0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4d0.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_4d0.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_4d0.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_540._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_540._M_dataplus._M_p,
                      local_540.field_2._M_allocated_capacity - (long)local_540._M_dataplus._M_p);
    }
    if (local_568._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_568._M_dataplus._M_p,
                      local_568.field_2._M_allocated_capacity - (long)local_568._M_dataplus._M_p);
    }
  }
  return lVar7;
}

Assistant:

virtual long Run()
	{
		_program = CreateProgram(shaders::vshSimple<api>(), "", shaders::fshSimple<api>(), true);
		if (!_program)
		{
			return ERROR;
		}
		glUseProgram(_program);

		CColorArray coords;
		PrimitiveGen(GL_TRIANGLES, 8, 8, coords);

		glGenVertexArrays(1, &_vao);
		glBindVertexArray(_vao);

		glGenBuffers(1, &_buffer);
		glBindBuffer(GL_ARRAY_BUFFER, _buffer);

		glBufferData(GL_ARRAY_BUFFER, (GLsizeiptr)(coords.size() * sizeof(coords[0])), &coords[0], GL_STREAM_DRAW);
		glVertexAttribPointer(0, sizeof(coords[0]) / sizeof(float), GL_FLOAT, GL_FALSE, sizeof(coords[0]), 0);
		glEnableVertexAttribArray(0);

		DrawElementsIndirectCommand indirectElements = { 0, 0, 0, 0, 0 };
		indirectElements.count						 = static_cast<GLuint>(coords.size()) / 2;
		indirectElements.primCount					 = 1;
		indirectElements.baseVertex					 = 0;
		indirectElements.firstIndex					 = static_cast<GLuint>(coords.size()) / 2;
		indirectElements.reservedMustBeZero			 = 0;

		CElementArray elements(coords.size(), 0);
		for (size_t i = 0; i < elements.size(); ++i)
		{
			elements[i] = static_cast<GLuint>(i);
		}

		glGenBuffers(1, &_bufferIndirect);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _bufferIndirect);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(DrawElementsIndirectCommand), &indirectElements, GL_STATIC_DRAW);

		glGenBuffers(1, &_ebo);
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, _ebo);
		glBufferData(GL_ELEMENT_ARRAY_BUFFER, (GLsizeiptr)(elements.size() * sizeof(elements[0])), &elements[0],
					 GL_STATIC_DRAW);

		glDrawElementsIndirect(GL_TRIANGLES, GL_UNSIGNED_INT, 0);

		CColorArray bufferRef1(getWindowWidth() * getWindowHeight() / 2, tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f));
		CColorArray bufferRef2(getWindowWidth() * getWindowHeight() / 2, tcu::Vec4(0.1f, 0.2f, 0.3f, 1.0f));
		CColorArray bufferTest(getWindowWidth() * getWindowHeight(), tcu::Vec4(0.0f));

		DIResult result;
		ReadPixelsFloat<api>(0, 0, getWindowWidth(), getWindowHeight() / 2, &bufferTest[0]);
		result.sub_result(BuffersCompare(bufferTest, getWindowWidth(), getWindowHeight() / 2, bufferRef1,
										 getWindowWidth(), getWindowHeight() / 2));

		ReadPixelsFloat<api>(0, (getWindowHeight() + 1) / 2, getWindowWidth(), getWindowHeight() / 2, &bufferTest[0]);
		result.sub_result(BuffersCompare(bufferTest, getWindowWidth(), getWindowHeight() / 2, bufferRef2,
										 getWindowWidth(), getWindowHeight() / 2));

		return result.code();
	}